

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

int get_prediction_error_bitdepth
              (int is_high_bitdepth,int bitdepth,BLOCK_SIZE block_size,buf_2d *src,buf_2d *ref)

{
  _func_uint_uint8_t_ptr_int_uint8_t_ptr_int_uint_ptr **pp_Var1;
  code *pcVar2;
  ulong uVar3;
  byte bVar4;
  undefined **ppuVar5;
  uint *puVar6;
  uint local_10;
  uint local_c;
  
  bVar4 = block_size - BLOCK_8X8;
  if (is_high_bitdepth == 0) {
    if (bVar4 < 3) {
      pp_Var1 = (_func_uint_uint8_t_ptr_int_uint8_t_ptr_int_uint_ptr **)
                (&PTR_aom_mse8x8_sse2_005cf848 + (char)bVar4);
    }
    else {
      pp_Var1 = &aom_mse16x16;
    }
    puVar6 = &local_c;
    (**pp_Var1)(src->buf,src->stride,ref->buf,ref->stride,puVar6);
    goto LAB_001cdcc8;
  }
  if (bitdepth == 10) {
    if (bVar4 < 3) {
      uVar3 = (ulong)(char)bVar4;
      ppuVar5 = &PTR_aom_highbd_10_mse8x8_sse2_005cf818;
      goto LAB_001cdcaa;
    }
    pp_Var1 = &aom_highbd_10_mse16x16;
LAB_001cdcae:
    pcVar2 = *pp_Var1;
  }
  else if (bitdepth == 0xc) {
    if (bVar4 < 3) {
      uVar3 = (ulong)bVar4;
      ppuVar5 = &PTR_aom_highbd_12_mse8x8_sse2_005cf830;
LAB_001cdcaa:
      pp_Var1 = (_func_uint_uint8_t_ptr_int_uint8_t_ptr_int_uint_ptr **)(ppuVar5 + uVar3);
      goto LAB_001cdcae;
    }
    pcVar2 = aom_highbd_12_mse16x16_sse2;
  }
  else {
    if (bVar4 < 3) {
      uVar3 = (ulong)bVar4;
      ppuVar5 = &PTR_aom_highbd_8_mse8x8_sse2_005cf800;
      goto LAB_001cdcaa;
    }
    pcVar2 = aom_highbd_8_mse16x16_sse2;
  }
  puVar6 = &local_10;
  (*pcVar2)(src->buf,src->stride,ref->buf,ref->stride,puVar6);
LAB_001cdcc8:
  return *puVar6;
}

Assistant:

static int get_prediction_error_bitdepth(const int is_high_bitdepth,
                                         const int bitdepth,
                                         const BLOCK_SIZE block_size,
                                         const struct buf_2d *src,
                                         const struct buf_2d *ref) {
  (void)is_high_bitdepth;
  (void)bitdepth;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_high_bitdepth) {
    return highbd_get_prediction_error(block_size, src, ref, bitdepth);
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  return get_prediction_error(block_size, src, ref);
}